

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-parser.cpp
# Opt level: O2

MaybeResult<wasm::WATParser::Ok> *
wasm::WATParser::anon_unknown_11::
plaininstr<wasm::WATParser::(anonymous_namespace)::ParseModuleTypesCtx>
          (MaybeResult<wasm::WATParser::Ok> *__return_storage_ptr__,ParseModuleTypesCtx *ctx)

{
  ParseInput *this;
  Index pos;
  MaybeResult<wasm::WATParser::Ok> *pMVar1;
  undefined1 local_188 [8];
  optional<std::basic_string_view<char,_std::char_traits<char>_>_> keyword;
  Index reset;
  Result<wasm::WATParser::Ok> ret_572;
  Result<wasm::WATParser::Ok> ret;
  undefined8 uStack_d8;
  char buf [33];
  Result<wasm::HeapType> destType;
  Result<wasm::HeapType> _val_1;
  Result<wasm::HeapType> srcType;
  
  this = &ctx->in;
  pos = ParseInput::getPos(this);
  ParseInput::takeKeyword
            ((optional<std::basic_string_view<char,_std::char_traits<char>_>_> *)local_188,this);
  if (keyword.
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_payload._8_1_ == '\0') {
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).
             super__Variant_base<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>.
             super__Move_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_assign_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Move_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Copy_ctor_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
             .
             super__Variant_storage_alias<wasm::WATParser::Ok,_wasm::WATParser::None,_wasm::WATParser::Err>
     + 0x20) = '\x01';
  }
  else {
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    uStack_d8 = 0;
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[0x18] = '\0';
    memcpy(&uStack_d8,
           (void *)keyword.
                   super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                   ._M_payload._M_value._M_len,(size_t)local_188);
    if ((byte)uStack_d8 - 0x61 < 0x16) {
      pMVar1 = (MaybeResult<wasm::WATParser::Ok> *)
               (*(code *)(&DAT_00bef968 +
                         *(int *)(&DAT_00bef968 + (ulong)((byte)uStack_d8 - 0x61) * 4)))();
      return pMVar1;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)
               &keyword.
                super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                ._M_engaged,"unrecognized instruction",
               (allocator<char> *)
               ((long)&_val_1.val.super__Variant_base<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Move_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Copy_assign_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Move_ctor_alias<wasm::HeapType,_wasm::WATParser::Err>.
                       super__Copy_ctor_alias<wasm::HeapType,_wasm::WATParser::Err> + 0x20));
    ParseInput::err((Err *)(buf + 0x20),this,pos,
                    (string *)
                    &keyword.
                     super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                     ._M_payload.
                     super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                     ._M_engaged);
    std::__detail::__variant::
    _Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::None,wasm::WATParser::Err>::
    _Variant_storage<2ul,wasm::WATParser::Err>
              ((_Variant_storage<false,wasm::WATParser::Ok,wasm::WATParser::None,wasm::WATParser::Err>
                *)__return_storage_ptr__,buf + 0x20);
    std::__cxx11::string::~string((string *)(buf + 0x20));
    std::__cxx11::string::~string
              ((string *)
               &keyword.
                super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                ._M_payload.
                super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                ._M_engaged);
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::InstrT> plaininstr(Ctx& ctx) {
  auto pos = ctx.in.getPos();
  auto keyword = ctx.in.takeKeyword();
  if (!keyword) {
    return {};
  }

#define NEW_INSTRUCTION_PARSER
#define NEW_WAT_PARSER
#include <gen-s-parser.inc>
}